

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalability_test.c
# Opt level: O1

int openclients(nng_socket *clients,int num)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  nng_socket local_34 [2];
  nng_socket c;
  
  if (0 < num) {
    uVar4 = 0;
    do {
      nVar1 = nng_req0_open(local_34);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/scalability_test.c"
                             ,0x32,"%s: expected success, got %s (%d)","nng_req0_open(&c)",pcVar3,
                             nVar1);
      if (iVar2 == 0) {
LAB_0010b91e:
        acutest_abort_();
      }
      nVar1 = nng_socket_set_ms(local_34[0],"recv-timeout",100);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/scalability_test.c"
                             ,0x33,"%s: expected success, got %s (%d)",
                             "nng_socket_set_ms(c, NNG_OPT_RECVTIMEO, t)",pcVar3,nVar1);
      if (iVar2 == 0) goto LAB_0010b91e;
      nVar1 = nng_socket_set_ms(local_34[0],"send-timeout",100);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/scalability_test.c"
                             ,0x34,"%s: expected success, got %s (%d)",
                             "nng_socket_set_ms(c, NNG_OPT_SENDTIMEO, t)",pcVar3,nVar1);
      if (iVar2 == 0) goto LAB_0010b91e;
      nVar1 = nng_dial(local_34[0],"inproc:///atscale",(nng_dialer *)0x0,0);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/scalability_test.c"
                             ,0x35,"%s: expected success, got %s (%d)","nng_dial(c, addr, NULL, 0)",
                             pcVar3,nVar1);
      if (iVar2 == 0) goto LAB_0010b91e;
      clients[uVar4].id = local_34[0].id;
      uVar4 = uVar4 + 1;
    } while ((uint)num != uVar4);
  }
  return 0;
}

Assistant:

int
openclients(nng_socket *clients, int num)
{
	int          i;
	nng_duration t;
	for (i = 0; i < num; i++) {
		t = 100; // 100ms
		nng_socket c;
		NUTS_PASS(nng_req0_open(&c));
		NUTS_PASS(nng_socket_set_ms(c, NNG_OPT_RECVTIMEO, t));
		NUTS_PASS(nng_socket_set_ms(c, NNG_OPT_SENDTIMEO, t));
		NUTS_PASS(nng_dial(c, addr, NULL, 0));
		clients[i] = c;
	}
	return (0);
}